

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::ProductAccumulation::Run
          (ProductAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer)

{
  size_type sVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t length;
  double *in_stack_ffffffffffffff60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  
  sVar6 = (size_type)
          (*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 1);
  if (((((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish & 0x10000000000) != 0) &&
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar1 == sVar6)) &&
     (in_RDX != 0)) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x10));
    if (sVar1 != sVar6) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::vector<double,_std::allocator<double>_>::end(in_RDI);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    *(int *)(in_RDX + 8) = *(int *)(in_RDX + 8) + 1;
    if (((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish & 0x100000000) == 0) {
      cVar2 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      cVar3 = std::vector<double,_std::allocator<double>_>::end(in_RDI);
      iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      iVar5 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                (cVar2._M_current,cVar3._M_current,iVar4._M_current,iVar5._M_current);
    }
    else {
      cVar2 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      cVar3 = std::vector<double,_std::allocator<double>_>::end(in_RDI);
      iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      iVar5 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::ProductAccumulation::Run(std::vector<double,std::allocator<double>>const&,sptk::ProductAccumulation::Buffer*)const::__0>
                (cVar2._M_current,cVar3._M_current,iVar4._M_current,iVar5._M_current);
    }
    return true;
  }
  return false;
}

Assistant:

bool ProductAccumulation::Run(const std::vector<double>& data,
                              ProductAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->interim_.size() != length) {
    buffer->interim_.resize(length);
    std::fill(buffer->interim_.begin(), buffer->interim_.end(), 1.0);
  }

  ++(buffer->num_data_);

  if (numerically_stable_) {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(),
                   [](double x, double y) { return std::log(x) + y; });
  } else {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(), std::multiplies<double>());
  }

  return true;
}